

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_aggsig_add_signatures_single
              (secp256k1_context *ctx,uchar *sig64,uchar **sigs,size_t num_sigs,
              secp256k1_pubkey *pubnonce_total)

{
  uchar **ppuVar1;
  uchar *puVar2;
  int iVar3;
  size_t sVar4;
  int overflow;
  secp256k1_pubkey *local_1c0;
  secp256k1_context *local_1b8;
  uchar *local_1b0;
  secp256k1_scalar local_1a8;
  secp256k1_scalar tmp;
  secp256k1_gej pubnonce_total_j;
  secp256k1_ge noncesum_pt;
  secp256k1_ge final;
  
  sVar4 = 0;
  do {
    if (num_sigs == sVar4) {
      local_1a8.d[2] = 0;
      local_1a8.d[3] = 0;
      local_1a8.d[0] = 0;
      local_1a8.d[1] = 0;
      sVar4 = 0;
      local_1c0 = pubnonce_total;
      local_1b8 = ctx;
      local_1b0 = sig64;
      while( true ) {
        if (num_sigs == sVar4) {
          secp256k1_gej_set_infinity(&pubnonce_total_j);
          secp256k1_pubkey_load(local_1b8,&noncesum_pt,local_1c0);
          secp256k1_gej_add_ge(&pubnonce_total_j,&pubnonce_total_j,&noncesum_pt);
          iVar3 = secp256k1_gej_has_quad_y_var(&pubnonce_total_j);
          if (iVar3 == 0) {
            secp256k1_gej_neg(&pubnonce_total_j,&pubnonce_total_j);
          }
          secp256k1_ge_set_gej(&final,&pubnonce_total_j);
          secp256k1_fe_normalize_var(&final.x);
          puVar2 = local_1b0;
          secp256k1_fe_get_b32(local_1b0,&final.x);
          secp256k1_scalar_get_b32(puVar2 + 0x20,&local_1a8);
          return 1;
        }
        secp256k1_scalar_set_b32(&tmp,sigs[sVar4] + 0x20,&overflow);
        if (overflow != 0) break;
        secp256k1_scalar_add(&local_1a8,&local_1a8,&tmp);
        sVar4 = sVar4 + 1;
      }
      return 0;
    }
    ppuVar1 = sigs + sVar4;
    sVar4 = sVar4 + 1;
  } while (*ppuVar1 != (uchar *)0x0);
  (*(ctx->illegal_callback).fn)("sigs[i] != NULL",(ctx->illegal_callback).data);
  return 0;
}

Assistant:

int secp256k1_aggsig_add_signatures_single(const secp256k1_context* ctx,
    unsigned char *sig64,
    const unsigned char** sigs,
    size_t num_sigs,
    const secp256k1_pubkey* pubnonce_total) {

    secp256k1_scalar s;
    secp256k1_ge final;
    secp256k1_scalar tmp;
    secp256k1_ge noncesum_pt;
    secp256k1_gej pubnonce_total_j;
    size_t i;
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(sigs != NULL);
    for (i=0;i<num_sigs;i++) ARG_CHECK(sigs[i] != NULL);
    ARG_CHECK(pubnonce_total != NULL);
    (void) ctx;

    /* Add signature portions together */
    secp256k1_scalar_set_int(&s, 0);
    for (i = 0; i < num_sigs; i++){
        secp256k1_scalar_set_b32(&tmp, sigs[i] + 32, &overflow);
        if (overflow) {
            return 0;
        }
        secp256k1_scalar_add(&s, &s, &tmp);
    }

    /* nonces should already be totalled */
    secp256k1_gej_set_infinity(&pubnonce_total_j);
    secp256k1_pubkey_load(ctx, &noncesum_pt, pubnonce_total);
    secp256k1_gej_add_ge(&pubnonce_total_j, &pubnonce_total_j, &noncesum_pt);
    if (!secp256k1_gej_has_quad_y_var(&pubnonce_total_j)) {
        secp256k1_gej_neg(&pubnonce_total_j, &pubnonce_total_j);
    }

    secp256k1_ge_set_gej(&final, &pubnonce_total_j);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &s);
    return 1;
}